

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_2_exponentiation_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  G->ss = G->val[-2];
  return;
}

Assistant:

YY_ACTION(void) yy_2_exponentiation_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define f2 G->val[-1]
#define f1 G->val[-2]
  yyprintf((stderr, "do yy_2_exponentiation_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        yy=f1;\n\
    }\n"));
  
        yy=f1;
    ;
#undef f2
#undef f1
}